

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O2

FT_UInt pcf_cmap_char_next(FT_CMap pcfcmap,FT_UInt32 *acharcode)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  FT_Face pFVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  pFVar4 = pcfcmap[1].charmap.face;
  uVar1 = *(ushort *)((long)&pFVar4->num_faces + 4);
  uVar6 = (*acharcode + 1 >> 8) - (uint)uVar1;
  uVar2 = (ushort)pFVar4->num_faces;
  uVar8 = (*acharcode + 1 & 0xff) - (uint)uVar2;
  uVar12 = ((uint)*(ushort *)((long)&pFVar4->num_faces + 6) - (uint)uVar1) + 1;
  uVar13 = ((uint)*(ushort *)((long)&pFVar4->num_faces + 2) - (uint)uVar2) + 1;
  uVar11 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar11;
  }
  uVar6 = (uint)uVar7;
  uVar10 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar10 = uVar11;
  }
  uVar8 = uVar12;
  if (uVar12 < uVar6) {
    uVar8 = uVar6;
  }
  uVar14 = (ulong)(uVar13 * uVar6);
  do {
    iVar9 = (int)uVar10;
    uVar6 = (uint)uVar7;
    if (uVar12 <= uVar6) {
      uVar5 = (uint)uVar11;
LAB_001ee04e:
      *acharcode = iVar9 + (uint)uVar2 | (uVar8 + uVar1) * 0x100;
      return uVar5;
    }
    while (uVar10 < uVar13) {
      uVar3 = *(ushort *)(pFVar4->face_flags + (ulong)(uint)((int)uVar14 + (int)uVar10) * 2);
      uVar5 = (uint)uVar3;
      uVar10 = uVar10 + 1;
      uVar11 = 0xffff;
      if (uVar3 != 0xffff) {
        iVar9 = (int)uVar10 + -1;
        uVar8 = uVar6;
        goto LAB_001ee04e;
      }
    }
    uVar7 = (ulong)(uVar6 + 1);
    uVar14 = uVar14 + uVar13;
    uVar10 = 0;
  } while( true );
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  pcf_cmap_char_next( FT_CMap    pcfcmap,   /* PCF_CMap */
                      FT_UInt32  *acharcode )
  {
    PCF_Enc    enc = ( (PCF_CMap)pcfcmap )->enc;
    FT_UInt32  charcode = *acharcode + 1;

    FT_UInt32  i = ( charcode >> 8   ) - enc->firstRow;
    FT_UInt32  j = ( charcode & 0xFF ) - enc->firstCol;
    FT_UInt32  h = enc->lastRow - enc->firstRow + 1;
    FT_UInt32  w = enc->lastCol - enc->firstCol + 1;

    FT_UInt  result = 0;


    /* adjust wrapped around "negative" values */
    if ( (FT_Int32)i < 0 )
      i = 0;
    if ( (FT_Int32)j < 0 )
      j = 0;

    for ( ; i < h; i++, j = 0 )
      for ( ; j < w; j++ )
      {
        result = (FT_UInt)enc->offset[i * w + j];
        if ( result != 0xFFFFU )
          goto Exit;
      }

  Exit:
    *acharcode = ( ( i + enc->firstRow ) << 8 ) | ( j + enc->firstCol );

    return result;
  }